

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::MessageOptions::MergeFrom(MessageOptions *this,MessageOptions *from)

{
  int *piVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  UninterpretedOption *from_00;
  void **ppvVar6;
  LogMessage *other;
  UninterpretedOption *this_00;
  long lVar7;
  LogFinisher local_61;
  LogMessage local_60;
  
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.pb.cc"
               ,0x148d);
    other = internal::LogMessage::operator<<(&local_60,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_61,other);
    internal::LogMessage::~LogMessage(&local_60);
  }
  internal::RepeatedPtrFieldBase::Reserve
            (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,
             (from->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ +
             (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_);
  if (0 < (from->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_) {
    lVar7 = 0;
    do {
      from_00 = (UninterpretedOption *)
                (from->uninterpreted_option_).super_RepeatedPtrFieldBase.elements_[lVar7];
      iVar4 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
      iVar5 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.allocated_size_;
      if (iVar4 < iVar5) {
        ppvVar6 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.elements_;
        (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = iVar4 + 1;
        this_00 = (UninterpretedOption *)ppvVar6[iVar4];
      }
      else {
        iVar4 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.total_size_;
        if (iVar5 == iVar4) {
          internal::RepeatedPtrFieldBase::Reserve
                    (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,iVar4 + 1);
        }
        piVar1 = &(this->uninterpreted_option_).super_RepeatedPtrFieldBase.allocated_size_;
        *piVar1 = *piVar1 + 1;
        this_00 = internal::GenericTypeHandler<google::protobuf::UninterpretedOption>::New();
        ppvVar6 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.elements_;
        iVar4 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
        (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = iVar4 + 1;
        ppvVar6[iVar4] = this_00;
      }
      UninterpretedOption::MergeFrom(this_00,from_00);
      lVar7 = lVar7 + 1;
    } while (lVar7 < (from->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_);
  }
  bVar2 = (byte)from->_has_bits_[0];
  if (bVar2 != 0) {
    if ((bVar2 & 1) != 0) {
      bVar3 = from->message_set_wire_format_;
      this->_has_bits_[0] = this->_has_bits_[0] | 1;
      this->message_set_wire_format_ = bVar3;
    }
    if ((from->_has_bits_[0] & 2) != 0) {
      bVar3 = from->no_standard_descriptor_accessor_;
      this->_has_bits_[0] = this->_has_bits_[0] | 2;
      this->no_standard_descriptor_accessor_ = bVar3;
    }
  }
  internal::ExtensionSet::MergeFrom(&this->_extensions_,&from->_extensions_);
  UnknownFieldSet::MergeFrom(&this->_unknown_fields_,&from->_unknown_fields_);
  return;
}

Assistant:

void MessageOptions::MergeFrom(const MessageOptions& from) {
  GOOGLE_CHECK_NE(&from, this);
  uninterpreted_option_.MergeFrom(from.uninterpreted_option_);
  if (from._has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    if (from.has_message_set_wire_format()) {
      set_message_set_wire_format(from.message_set_wire_format());
    }
    if (from.has_no_standard_descriptor_accessor()) {
      set_no_standard_descriptor_accessor(from.no_standard_descriptor_accessor());
    }
  }
  _extensions_.MergeFrom(from._extensions_);
  mutable_unknown_fields()->MergeFrom(from.unknown_fields());
}